

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdasher.cpp
# Opt level: O1

void __thiscall VDasher::updateActiveSegment(VDasher *this)

{
  float fVar1;
  ulong uVar2;
  Dash *pDVar3;
  
  do {
    this->mStartNewSegment = true;
    if (this->mDiscard == true) {
      this->mDiscard = false;
      uVar2 = (this->mIndex + 1) % this->mArraySize;
      this->mIndex = uVar2;
      pDVar3 = this->mDashArray + uVar2;
    }
    else {
      this->mDiscard = true;
      pDVar3 = (Dash *)&this->mDashArray[this->mIndex].gap;
    }
    fVar1 = pDVar3->length;
    this->mCurrentLength = fVar1;
  } while (ABS(fVar1) <= 1e-06);
  return;
}

Assistant:

void VDasher::updateActiveSegment()
{
    mStartNewSegment = true;

    if (mDiscard) {
        mDiscard = false;
        mIndex = (mIndex + 1) % mArraySize;
        mCurrentLength = mDashArray[mIndex].length;
    } else {
        mDiscard = true;
        mCurrentLength = mDashArray[mIndex].gap;
    }
    if (vIsZero(mCurrentLength)) updateActiveSegment();
}